

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

void __thiscall
NativeCodeGenerator::PrioritizedButNotYetProcessed(NativeCodeGenerator *this,Job *job)

{
  ThreadContextId pvVar1;
  code *pcVar2;
  bool bVar3;
  CodeGenWorkItemType CVar4;
  ExecutionMode EVar5;
  ThreadContextId pvVar6;
  undefined4 *puVar7;
  ScriptContext *pSVar8;
  QueuedFullJitWorkItem *element;
  CodeGenWorkItem *local_48;
  QueuedFullJitWorkItem *queuedFullJitWorkItem;
  CodeGenWorkItem *codeGenWorkItem;
  Job *job_local;
  NativeCodeGenerator *this_local;
  
  pvVar1 = this->mainThreadId;
  pvVar6 = GetCurrentThreadContextId();
  if (pvVar1 != pvVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x70e,"(mainThreadId == GetCurrentThreadContextId())",
                       "Cannot use this member of native code generator from thread other than the creating context\'s current thread"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (job == (Job *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x70f,"(job)","job");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (job == (Job *)0x0) {
    local_48 = (CodeGenWorkItem *)0x0;
  }
  else {
    local_48 = (CodeGenWorkItem *)&job[-1].isCritical;
  }
  CVar4 = CodeGenWorkItem::Type(local_48);
  if ((CVar4 == JsFunctionType) && (bVar3 = CodeGenWorkItem::IsInJitQueue(local_48), bVar3)) {
    pSVar8 = CodeGenWorkItem::GetScriptContext(local_48);
    pSVar8->interpretedCallsHighPri = pSVar8->interpretedCallsHighPri + 1;
    EVar5 = CodeGenWorkItem::GetJitMode(local_48);
    if ((EVar5 == FullJit) &&
       (element = CodeGenWorkItem::GetQueuedFullJitWorkItem(local_48),
       element != (QueuedFullJitWorkItem *)0x0)) {
      JsUtil::DoublyLinkedList<QueuedFullJitWorkItem,_Memory::ArenaAllocator>::MoveToBeginning
                (&this->queuedFullJitWorkItems,element);
    }
  }
  return;
}

Assistant:

void
NativeCodeGenerator::PrioritizedButNotYetProcessed(JsUtil::Job *const job)
{
    // This function is called from inside the lock

    ASSERT_THREAD();
    Assert(job);

    CodeGenWorkItem *const codeGenWorkItem = static_cast<CodeGenWorkItem *>(job);
    if(codeGenWorkItem->Type() == JsFunctionType && codeGenWorkItem->IsInJitQueue())
    {
#ifdef BGJIT_STATS
        codeGenWorkItem->GetScriptContext()->interpretedCallsHighPri++;
#endif
        if(codeGenWorkItem->GetJitMode() == ExecutionMode::FullJit)
        {
            QueuedFullJitWorkItem *const queuedFullJitWorkItem = codeGenWorkItem->GetQueuedFullJitWorkItem();
            if(queuedFullJitWorkItem)
            {
                queuedFullJitWorkItems.MoveToBeginning(queuedFullJitWorkItem);
            }
        }
    }
}